

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger.cpp
# Opt level: O2

int __thiscall Debugger::FuzzyMatchFileName(Debugger *this,string *chunkName,string *fileName)

{
  char cVar1;
  char cVar2;
  size_type sVar3;
  size_type sVar4;
  pointer pbVar5;
  pointer pcVar6;
  pointer pcVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  int i;
  uint uVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ext;
  pointer end;
  long lVar16;
  ulong uVar17;
  int local_54;
  
  sVar3 = chunkName->_M_string_length;
  sVar4 = fileName->_M_string_length;
  pbVar5 = (this->manager->extNames).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar13 = 0;
  uVar12 = 0;
  for (end = (this->manager->extNames).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start; end != pbVar5; end = end + 1) {
    bVar8 = EndWith(chunkName,end);
    if ((bVar8) && (uVar12 < end->_M_string_length)) {
      uVar12 = end->_M_string_length;
    }
    bVar8 = EndWith(fileName,end);
    if ((bVar8) && (uVar13 < end->_M_string_length)) {
      uVar13 = end->_M_string_length;
    }
  }
  uVar12 = sVar3 - uVar12;
  uVar13 = sVar4 - uVar13;
  uVar14 = uVar12;
  if (uVar13 < uVar12) {
    uVar14 = uVar13;
  }
  pcVar6 = (chunkName->_M_dataplus)._M_p;
  pcVar7 = (fileName->_M_dataplus)._M_p;
  uVar15 = 1;
  local_54 = 1;
  do {
    if (uVar15 == (uint)uVar14) {
      return local_54;
    }
    lVar16 = uVar12 - (long)(int)uVar15;
    cVar1 = pcVar6[lVar16];
    cVar2 = pcVar7[uVar13 - (long)(int)uVar15];
    if (cVar1 != cVar2) {
      iVar9 = tolower((int)cVar1);
      iVar10 = tolower((int)cVar2);
      if (iVar9 != iVar10) {
        if ((cVar1 == '\\') || (cVar1 == '/')) {
          if ((cVar2 == '\\') || (cVar2 == '/')) {
            local_54 = local_54 + 1;
          }
          else {
            uVar13 = uVar13 + 1;
          }
        }
        else {
          if (cVar1 != '.') {
            return 0;
          }
          uVar17 = lVar16 + 1;
          if (uVar12 <= uVar17) {
            return 0;
          }
          if ((pcVar6[uVar17] != '\\') && (pcVar6[uVar17] != '/')) {
            return 0;
          }
          uVar11 = ~uVar15 + (int)uVar12;
          if ((int)uVar11 < 0) {
            return local_54;
          }
          if ((pcVar6[uVar11] != '\\') && (pcVar6[uVar11] != '/')) {
            return 0;
          }
          uVar15 = uVar15 + 1;
          uVar13 = uVar13 + 2;
        }
      }
    }
    uVar15 = uVar15 + 1;
  } while( true );
}

Assistant:

int Debugger::FuzzyMatchFileName(const std::string &chunkName, const std::string &fileName) const {
	auto chunkSize = chunkName.size();
	auto fileSize = fileName.size();


	std::size_t chunkExtSize = 0;
	std::size_t fileExtSize = 0;
	// trim 掉后缀
	for (const auto &ext: manager->extNames) {
		if (EndWith(chunkName, ext)) {
			if (ext.size() > chunkExtSize) {
				chunkExtSize = ext.size();
			}
		}

		if (EndWith(fileName, ext)) {
			if (ext.size() > fileExtSize) {
				fileExtSize = ext.size();
			}
		}
	}

	chunkSize -= chunkExtSize;
	fileSize -= fileExtSize;

	// 我们用chunkname去匹配filename
	int maxMatchSize = static_cast<int>(std::min(chunkSize, fileSize));

	int matchProcess = 1;

	for (int i = 1; i != maxMatchSize; i++) {
		char cChar = chunkName[chunkSize - i];
		char fChar = fileName[fileSize - i];

		if (cChar != fChar) {
			// 以下匹配顺序是有意义的，不要轻易改变

			if (::tolower(cChar) == ::tolower(fChar)) {
				continue;
			}

			// 认为来自编辑器的路径不会是相对路径
			// chunkname有可能是(./aaaa)也可能是(aaa/./bbb)
			// 并不匹配(../)的情况
			// 因为 ../的路径意义并不唯一
			if (cChar == '.') {
				std::size_t cLastindex = chunkSize - i + 1;

				if (cLastindex >= chunkSize) {
					matchProcess = 0;
					break;
				}

				char cLastChar = chunkName[cLastindex];
				if (cLastChar != '/' && cLastChar != '\\') {
					matchProcess = 0;
					break;
				}

				// 该值可能为负数
				int cNextIndex = static_cast<int>(chunkSize) - i - 1;
				if (cNextIndex < 0) {
					// 匹配已经完毕
					break;
				}

				char cNextChar = chunkName[cNextIndex];

				// 那chunkname 就是 aaa./bbbb 那就不匹配
				if (cNextChar != '/' && cNextChar != '\\') {
					matchProcess = 0;
					break;
				}

				// 这里会消耗掉 next的匹配
				i++;

				// 这里是指保持下一次循环时fChar不变
				fileSize += 2;
				continue;
			}

			if (cChar == '/' || cChar == '\\') {
				if (fChar == '/' || fChar == '\\') {
					matchProcess++;
					continue;
				}
				// 一些人会写出 require './aaaa' 这种代码
				// 导致lua程序 的chunkname 给的是 .\\/aaaa.lua


				//保持fChar 下次循环时不变
				fileSize++;
				continue;
			}

			// 那就是不匹配
			matchProcess = 0;
			break;
		}
	}

	return matchProcess;
}